

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.cpp
# Opt level: O2

void __thiscall uv11::Async::Async(Async *this,Loop *loop,Callback *cb)

{
  uv_loop_t *puVar1;
  
  (this->super_HandleBase<uv_async_s>).super_Handle._vptr_Handle =
       (_func_int **)&PTR__Async_0010dc30;
  HandleBase<uv_async_s>::HandleBase(&this->super_HandleBase<uv_async_s>,this);
  (this->super_HandleBase<uv_async_s>).super_Handle._vptr_Handle =
       (_func_int **)&PTR__Async_0010dc30;
  std::function<void_(uv11::Async_&)>::function(&this->async_cb,cb);
  puVar1 = Loop::Get(loop);
  uv_async_init(puVar1,&(this->super_HandleBase<uv_async_s>).super_WrappedObject<uv_async_s>,
                Async::anon_class_1_0_00000001::__invoke);
  return;
}

Assistant:

Async::Async(Loop& loop, Async::Callback const& cb) : HandleBase(this), async_cb(cb) {
    ::uv_async_init(&loop.Get(), &this->Get(), [] (::uv_async_t* handle ) {
        Async* a = reinterpret_cast<Async*>(handle->data);
        auto callback = a->async_cb;
        callback(*a);
    });
}